

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
CreateFunctionAccess
          (ExpressionContext *ctx,SynBase *source,FunctionLookupChain chain,ExprBase *context)

{
  TypeBase *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeFunctionSet *pTVar4;
  ExprFunctionAccess *this;
  SynBase *source_00;
  undefined4 extraout_var_02;
  ulong uVar5;
  Node *pNVar6;
  ArrayView<TypeBase_*> setTypes;
  IntrusiveList<FunctionHandle> functions;
  FunctionLookupChain local_118;
  IntrusiveList<FunctionHandle> local_f8;
  FunctionLookupChain local_e0;
  SmallArray<TypeBase_*,_16U> local_c8;
  FunctionHandle *pFVar3;
  undefined4 extraout_var_01;
  
  anon_unknown.dwarf_1117a3::FunctionLookupChain::next(&local_118,&chain);
  pNVar6 = chain.node.node;
  if (local_118.node.node == (Node *)0x0) {
    if (context == (ExprBase *)0x0) {
      source_00 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      pNVar6 = chain.node.node;
      context = CreateFunctionContextAccess
                          (ctx,source_00,*(FunctionData **)(chain.node.node + 0x10));
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    this = (ExprFunctionAccess *)CONCAT44(extraout_var_02,iVar2);
    ExprFunctionAccess::ExprFunctionAccess
              (this,source,&(*(FunctionData **)(pNVar6 + 0x10))->type->super_TypeBase,
               *(FunctionData **)(pNVar6 + 0x10),context);
  }
  else {
    local_c8.allocator = ctx->allocator;
    local_c8.data = local_c8.little;
    local_c8.max = 0x10;
    local_f8.head = (FunctionHandle *)0x0;
    local_f8.tail = (FunctionHandle *)0x0;
    local_c8.little[0] = *(TypeBase **)(*(long *)(chain.node.node + 0x10) + 0x28);
    local_c8.count = 1;
    iVar2 = (*(local_c8.allocator)->_vptr_Allocator[2])(local_c8.allocator,0x18);
    pFVar3 = (FunctionHandle *)CONCAT44(extraout_var,iVar2);
    pFVar3->function = *(FunctionData **)(pNVar6 + 0x10);
    pFVar3->next = (FunctionHandle *)0x0;
    pFVar3->listed = false;
    IntrusiveList<FunctionHandle>::push_back(&local_f8,pFVar3);
    pNVar6 = local_118.node.node;
    do {
      pTVar1 = *(TypeBase **)(*(long *)(pNVar6 + 0x10) + 0x28);
      if (local_c8.count == local_c8.max) {
        SmallArray<TypeBase_*,_16U>::grow(&local_c8,local_c8.count);
      }
      if (local_c8.data == (TypeBase **)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<TypeBase *, 16>::push_back(const T &) [T = TypeBase *, N = 16]"
                     );
      }
      uVar5 = (ulong)local_c8.count;
      local_c8.count = local_c8.count + 1;
      local_c8.data[uVar5] = pTVar1;
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
      pFVar3 = (FunctionHandle *)CONCAT44(extraout_var_00,iVar2);
      pFVar3->function = *(FunctionData **)(pNVar6 + 0x10);
      pFVar3->next = (FunctionHandle *)0x0;
      pFVar3->listed = false;
      IntrusiveList<FunctionHandle>::push_back(&local_f8,pFVar3);
      anon_unknown.dwarf_1117a3::FunctionLookupChain::next(&local_e0,&local_118);
      local_118.scope = local_e0.scope;
      local_118.node.start = local_e0.node.start;
      local_118.node.node = local_e0.node.node;
      pNVar6 = local_e0.node.node;
    } while (local_e0.node.node != (Node *)0x0);
    setTypes.count = local_c8.count;
    setTypes.data = local_c8.data;
    setTypes._12_4_ = 0;
    pTVar4 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    this = (ExprFunctionAccess *)CONCAT44(extraout_var_01,iVar2);
    (this->super_ExprBase).typeID = 0x27;
    (this->super_ExprBase).source = source;
    (this->super_ExprBase).type = &pTVar4->super_TypeBase;
    (this->super_ExprBase).next = (ExprBase *)0x0;
    (this->super_ExprBase).listed = false;
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6978;
    this->function = (FunctionData *)local_f8.head;
    this->context = (ExprBase *)local_f8.tail;
    this[1].super_ExprBase._vptr_ExprBase = (_func_int **)context;
    SmallArray<TypeBase_*,_16U>::~SmallArray(&local_c8);
  }
  return &this->super_ExprBase;
}

Assistant:

ExprBase* CreateFunctionAccess(ExpressionContext &ctx, SynBase *source, FunctionLookupChain chain, ExprBase *context)
{
	if(FunctionLookupChain curr = chain.next())
	{
		SmallArray<TypeBase*, 16> types(ctx.allocator);
		IntrusiveList<FunctionHandle> functions;

		types.push_back(chain->type);
		functions.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(*chain));

		while(curr)
		{
			types.push_back(curr->type);
			functions.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(*curr));

			curr = curr.next();
		}

		TypeFunctionSet *type = ctx.GetFunctionSetType(types);

		return new (ctx.get<ExprFunctionOverloadSet>()) ExprFunctionOverloadSet(source, type, functions, context);
	}

	if(!context)
		context = CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), *chain);

	return new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(source, chain->type, *chain, context);
}